

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BReverbModel.cpp
# Opt level: O2

int __thiscall
MT32Emu::BReverbModelImpl<float>::open(BReverbModelImpl<float> *this,char *__file,int __oflag,...)

{
  int iVar1;
  AllpassFilter<float> **ppAVar2;
  AllpassFilter<float> *this_00;
  CombFilter<float> **ppCVar3;
  TapDelayCombFilter<float> *this_01;
  CombFilter<float> *pCVar4;
  Bit32u i_1;
  BReverbSettings *pBVar5;
  ulong uVar6;
  Bit32u i;
  ulong uVar7;
  
  iVar1 = (*(this->super_BReverbModel)._vptr_BReverbModel[2])(this,__file,___oflag);
  if ((char)iVar1 != '\0') {
    return iVar1;
  }
  pBVar5 = this->currentSettings;
  uVar6 = (ulong)pBVar5->numberOfAllpasses;
  if (uVar6 != 0) {
    ppAVar2 = (AllpassFilter<float> **)operator_new__(uVar6 << 3);
    this->allpasses = ppAVar2;
    for (uVar7 = 0; uVar7 < uVar6; uVar7 = uVar7 + 1) {
      this_00 = (AllpassFilter<float> *)operator_new(0x18);
      AllpassFilter<float>::AllpassFilter(this_00,pBVar5->allpassSizes[uVar7]);
      this->allpasses[uVar7] = this_00;
      pBVar5 = this->currentSettings;
      uVar6 = (ulong)pBVar5->numberOfAllpasses;
    }
  }
  ppCVar3 = (CombFilter<float> **)operator_new__((ulong)pBVar5->numberOfCombs << 3);
  this->combs = ppCVar3;
  if (this->tapDelayMode == true) {
    this_01 = (TapDelayCombFilter<float> *)operator_new(0x28);
    TapDelayCombFilter<float>::TapDelayCombFilter(this_01,*pBVar5->combSizes,*pBVar5->filterFactors)
    ;
    *this->combs = (CombFilter<float> *)this_01;
  }
  else {
    pCVar4 = (CombFilter<float> *)operator_new(0x20);
    DelayWithLowPassFilter<float>::DelayWithLowPassFilter
              ((DelayWithLowPassFilter<float> *)pCVar4,*pBVar5->combSizes,*pBVar5->filterFactors,
               pBVar5->lpfAmp);
    *this->combs = pCVar4;
    for (uVar6 = 1; pBVar5 = this->currentSettings, uVar6 < pBVar5->numberOfCombs; uVar6 = uVar6 + 1
        ) {
      pCVar4 = (CombFilter<float> *)operator_new(0x20);
      CombFilter<float>::CombFilter(pCVar4,pBVar5->combSizes[uVar6],pBVar5->filterFactors[uVar6]);
      this->combs[uVar6] = pCVar4;
    }
  }
  iVar1 = (*(this->super_BReverbModel)._vptr_BReverbModel[5])(this);
  return iVar1;
}

Assistant:

void open() {
		if (isOpen()) return;
		if (currentSettings.numberOfAllpasses > 0) {
			allpasses = new AllpassFilter<Sample>*[currentSettings.numberOfAllpasses];
			for (Bit32u i = 0; i < currentSettings.numberOfAllpasses; i++) {
				allpasses[i] = new AllpassFilter<Sample>(currentSettings.allpassSizes[i]);
			}
		}
		combs = new CombFilter<Sample>*[currentSettings.numberOfCombs];
		if (tapDelayMode) {
			*combs = new TapDelayCombFilter<Sample>(*currentSettings.combSizes, *currentSettings.filterFactors);
		} else {
			combs[0] = new DelayWithLowPassFilter<Sample>(currentSettings.combSizes[0], currentSettings.filterFactors[0], currentSettings.lpfAmp);
			for (Bit32u i = 1; i < currentSettings.numberOfCombs; i++) {
				combs[i] = new CombFilter<Sample>(currentSettings.combSizes[i], currentSettings.filterFactors[i]);
			}
		}
		mute();
	}